

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

App * __thiscall CLI::App::_get_fallthrough_parent(App *this)

{
  HorribleError *this_00;
  byte local_69;
  App *local_50;
  App *fallthrough_parent;
  allocator local_31;
  string local_30;
  App *local_10;
  App *this_local;
  
  local_10 = this;
  if (this->parent_ == (App *)0x0) {
    this_00 = (HorribleError *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_30,"No Valid parent",&local_31);
    HorribleError::HorribleError(this_00,&local_30);
    __cxa_throw(this_00,&HorribleError::typeinfo,HorribleError::~HorribleError);
  }
  local_50 = this->parent_;
  while( true ) {
    local_69 = 0;
    if (local_50->parent_ != (App *)0x0) {
      get_name_abi_cxx11_(local_50);
      local_69 = ::std::__cxx11::string::empty();
    }
    if ((local_69 & 1) == 0) break;
    local_50 = local_50->parent_;
  }
  return local_50;
}

Assistant:

CLI11_INLINE App *App::_get_fallthrough_parent() {
    if(parent_ == nullptr) {
        throw(HorribleError("No Valid parent"));
    }
    auto *fallthrough_parent = parent_;
    while((fallthrough_parent->parent_ != nullptr) && (fallthrough_parent->get_name().empty())) {
        fallthrough_parent = fallthrough_parent->parent_;
    }
    return fallthrough_parent;
}